

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

void __thiscall
OpenMD::Snapshot::Snapshot(Snapshot *this,int nAtoms,int nRigidbodies,int nCutoffGroups,bool usePBC)

{
  long in_RDI;
  byte in_R8B;
  Vector3<double> *this_00;
  pair<double,_double> pVar1;
  SquareMatrix3<double> *in_stack_fffffffffffffd38;
  SquareMatrix3<double> *in_stack_fffffffffffffd40;
  Vector<double,_7U> *in_stack_fffffffffffffd48;
  FrameData *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffde4;
  size_t in_stack_fffffffffffffde8;
  DataStorage *in_stack_fffffffffffffdf0;
  Snapshot *this_01;
  pair<double,_double> local_1a8;
  undefined8 local_198;
  undefined8 local_190;
  pair<double,_double> local_188;
  double local_178;
  Vector<double,_7U> local_170;
  double local_138;
  Vector<double,_7U> local_130;
  double local_f8;
  Vector<double,_7U> local_f0 [3];
  byte local_15;
  
  local_15 = in_R8B & 1;
  DataStorage::DataStorage
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  DataStorage::DataStorage
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  DataStorage::DataStorage
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  FrameData::FrameData(in_stack_fffffffffffffd90);
  *(undefined8 *)(in_RDI + 0xa90) = 0x3eb0c6f7a0b5ed8d;
  *(undefined4 *)(in_RDI + 0x540) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x548) = 0;
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f76fe);
  SquareMatrix3<double>::SquareMatrix3(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
  SquareMatrix3<double>::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f7738);
  *(undefined1 *)(in_RDI + 0x671) = 0;
  *(byte *)(in_RDI + 0x670) = local_15 & 1;
  *(undefined8 *)(in_RDI + 0x6c8) = 0;
  *(undefined8 *)(in_RDI + 0x6d0) = 0;
  *(undefined8 *)(in_RDI + 0x6d8) = 0;
  *(undefined8 *)(in_RDI + 0x6e0) = 0;
  local_f8 = 0.0;
  Vector<double,_7U>::Vector(local_f0,&local_f8);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffd48,(Vector<double,_7U> *)in_stack_fffffffffffffd40);
  *(undefined8 *)(in_RDI + 0x6c0) = 0;
  *(undefined8 *)(in_RDI + 0x6b8) = 0;
  local_138 = 0.0;
  Vector<double,_7U>::Vector(&local_130,&local_138);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffd48,(Vector<double,_7U> *)in_stack_fffffffffffffd40);
  local_178 = 0.0;
  Vector<double,_7U>::Vector(&local_170,&local_178);
  Vector<double,_7U>::operator=
            (in_stack_fffffffffffffd48,(Vector<double,_7U> *)in_stack_fffffffffffffd40);
  *(undefined8 *)(in_RDI + 0x7a0) = 0;
  *(undefined8 *)(in_RDI + 0x7a8) = 0;
  *(undefined8 *)(in_RDI + 0x7e8) = 0;
  *(undefined8 *)(in_RDI + 0x7f0) = 0;
  *(undefined8 *)(in_RDI + 0x7f8) = 0;
  *(undefined8 *)(in_RDI + 0x800) = 0;
  local_190 = 0;
  local_198 = 0;
  local_188 = std::make_pair<double,double>
                        ((double *)in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  this_00 = (Vector3<double> *)local_188.second;
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x818),&local_188);
  this_01 = (Snapshot *)0x0;
  pVar1 = std::make_pair<double,double>
                    ((double *)in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  local_1a8 = pVar1;
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x840),&local_1a8);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)pVar1.second,(double)in_stack_fffffffffffffd38);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)pVar1.second,in_stack_fffffffffffffd38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f79ba);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)pVar1.second,(double)in_stack_fffffffffffffd38);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)pVar1.second,in_stack_fffffffffffffd38);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1f79f4);
  Vector3<double>::Vector3(this_00,pVar1.first,pVar1.second,(double)in_stack_fffffffffffffd38);
  Vector3<double>::operator=
            ((Vector3<double> *)pVar1.second,(Vector3<double> *)in_stack_fffffffffffffd38);
  std::make_shared<OpenMD::SPFData>();
  std::shared_ptr<OpenMD::SPFData>::operator=
            ((shared_ptr<OpenMD::SPFData> *)pVar1.second,
             (shared_ptr<OpenMD::SPFData> *)&stack0xfffffffffffffd90);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x1f7a50);
  clearDerivedProperties(this_01);
  return;
}

Assistant:

Snapshot::Snapshot(int nAtoms, int nRigidbodies, int nCutoffGroups,
                     bool usePBC) :
      atomData(nAtoms),
      rigidbodyData(nRigidbodies),
      cgData(nCutoffGroups, DataStorage::dslPosition), orthoTolerance_(1e-6) {
    frameData.id                   = -1;
    frameData.currentTime          = 0;
    frameData.hmat                 = Mat3x3d(0.0);
    frameData.invHmat              = Mat3x3d(0.0);
    frameData.orthoRhombic         = false;
    frameData.usePBC               = usePBC;
    frameData.bondPotential        = 0.0;
    frameData.bendPotential        = 0.0;
    frameData.torsionPotential     = 0.0;
    frameData.inversionPotential   = 0.0;
    frameData.lrPotentials         = potVec(0.0);
    frameData.surfacePotential     = 0.0;
    frameData.reciprocalPotential  = 0.0;
    frameData.selfPotentials       = potVec(0.0);
    frameData.excludedPotentials   = potVec(0.0);
    frameData.restraintPotential   = 0.0;
    frameData.rawPotential         = 0.0;
    frameData.xyArea               = 0.0;
    frameData.xzArea               = 0.0;
    frameData.yzArea               = 0.0;
    frameData.volume               = 0.0;
    frameData.thermostat           = make_pair(0.0, 0.0);
    frameData.electronicThermostat = make_pair(0.0, 0.0);
    frameData.barostat             = Mat3x3d(0.0);
    frameData.virialTensor         = Mat3x3d(0.0);
    frameData.conductiveHeatFlux   = Vector3d(0.0, 0.0, 0.0);
    frameData.spfData              = std::make_shared<SPFData>();
    clearDerivedProperties();
  }